

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pooling3d.cpp
# Opt level: O2

int __thiscall ncnn::Pooling3D::forward(Pooling3D *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float *pfVar1;
  float fVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  size_t _elemsize;
  int iVar6;
  void *pvVar7;
  int i;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  uint uVar18;
  int iVar19;
  int j_1;
  int iVar20;
  int iVar21;
  int iVar22;
  ulong uVar23;
  int iVar24;
  int iw_1;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  long lVar29;
  int iVar30;
  int j;
  ulong uVar31;
  long lVar32;
  int kj;
  ulong uVar33;
  long lVar34;
  int iVar35;
  uint _c;
  long lVar36;
  float fVar37;
  void *local_228;
  void *local_210;
  void *local_1d8;
  Mat bottom_blob_bordered;
  Mat local_120;
  Mat m;
  vector<int,_std::allocator<int>_> _space_ofs;
  Option opt_pad;
  
  iVar19 = bottom_blob->w;
  iVar21 = bottom_blob->h;
  iVar11 = bottom_blob->d;
  _c = bottom_blob->c;
  _elemsize = bottom_blob->elemsize;
  if (this->global_pooling == 0) {
    if (this->adaptive_pooling == 0) {
      bottom_blob_bordered.cstep = 0;
      bottom_blob_bordered.data = (void *)0x0;
      bottom_blob_bordered.refcount._0_4_ = 0;
      bottom_blob_bordered.refcount._4_4_ = 0;
      bottom_blob_bordered.elemsize._0_4_ = 0;
      bottom_blob_bordered._20_8_ = 0;
      bottom_blob_bordered.allocator = (Allocator *)0x0;
      bottom_blob_bordered.dims = 0;
      bottom_blob_bordered.w = 0;
      bottom_blob_bordered.h = 0;
      bottom_blob_bordered.d = 0;
      bottom_blob_bordered.c = 0;
      opt_pad.lightmode = opt->lightmode;
      opt_pad._1_3_ = *(undefined3 *)&opt->field_0x1;
      opt_pad.num_threads = opt->num_threads;
      opt_pad.blob_allocator = opt->blob_allocator;
      opt_pad.workspace_allocator = opt->workspace_allocator;
      opt_pad.openmp_blocktime = opt->openmp_blocktime;
      opt_pad.use_winograd_convolution = opt->use_winograd_convolution;
      opt_pad.use_sgemm_convolution = opt->use_sgemm_convolution;
      opt_pad.use_int8_inference = opt->use_int8_inference;
      opt_pad.use_vulkan_compute = opt->use_vulkan_compute;
      uVar31._0_1_ = opt->use_bf16_storage;
      uVar31._1_1_ = opt->use_fp16_packed;
      uVar31._2_1_ = opt->use_fp16_storage;
      uVar31._3_1_ = opt->use_fp16_arithmetic;
      uVar31._4_1_ = opt->use_int8_packed;
      uVar31._5_1_ = opt->use_int8_storage;
      uVar31._6_1_ = opt->use_int8_arithmetic;
      uVar31._7_1_ = opt->use_packing_layout;
      opt_pad.use_shader_pack8 = opt->use_shader_pack8;
      opt_pad.use_subgroup_basic = opt->use_subgroup_basic;
      opt_pad.use_subgroup_vote = opt->use_subgroup_vote;
      opt_pad.use_subgroup_ballot = opt->use_subgroup_ballot;
      opt_pad.use_subgroup_shuffle = opt->use_subgroup_shuffle;
      opt_pad.use_image_storage = opt->use_image_storage;
      opt_pad.use_tensor_storage = opt->use_tensor_storage;
      opt_pad.use_weight_fp16_storage = opt->use_weight_fp16_storage;
      opt_pad.flush_denormals = opt->flush_denormals;
      opt_pad.use_local_pool_allocator = opt->use_local_pool_allocator;
      opt_pad.use_reserved_1 = opt->use_reserved_1;
      opt_pad.use_reserved_2 = opt->use_reserved_2;
      opt_pad.use_reserved_3 = opt->use_reserved_3;
      opt_pad.use_reserved_4 = opt->use_reserved_4;
      opt_pad.use_reserved_5 = opt->use_reserved_5;
      opt_pad.use_reserved_6 = opt->use_reserved_6;
      opt_pad.use_reserved_7 = opt->use_reserved_7;
      opt_pad.use_reserved_8 = opt->use_reserved_8;
      opt_pad.use_reserved_9 = opt->use_reserved_9;
      opt_pad.use_reserved_10 = opt->use_reserved_10;
      opt_pad.use_reserved_11 = opt->use_reserved_11;
      opt_pad._32_8_ = uVar31 & 0xffffffffffffff;
      make_padding(this,bottom_blob,&bottom_blob_bordered,&opt_pad);
      iVar11 = bottom_blob_bordered.h;
      iVar21 = bottom_blob_bordered.w;
      iVar19 = -100;
      if ((bottom_blob_bordered.data != (void *)0x0) &&
         ((long)bottom_blob_bordered.c * bottom_blob_bordered.cstep != 0)) {
        iVar12 = bottom_blob_bordered.d;
        iVar22 = (bottom_blob_bordered.w - this->kernel_w) / this->stride_w;
        iVar3 = (bottom_blob_bordered.h - this->kernel_h) / this->stride_h;
        iVar20 = iVar22 + 1;
        iVar4 = (bottom_blob_bordered.d - this->kernel_d) / this->stride_d;
        Mat::create(top_blob,iVar20,iVar3 + 1,iVar4 + 1,_c,_elemsize,(Allocator *)0x0);
        if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
          uVar31 = (long)this->kernel_d * (long)this->kernel_h * (long)this->kernel_w;
          std::vector<int,_std::allocator<int>_>::vector(&_space_ofs,uVar31,(allocator_type *)&m);
          iVar19 = this->kernel_w;
          iVar8 = this->kernel_h;
          iVar25 = iVar11 - iVar8;
          iVar24 = iVar21 - iVar19;
          iVar9 = 0;
          iVar28 = 0;
          for (iVar27 = 0; iVar27 < this->kernel_d; iVar27 = iVar27 + 1) {
            for (iVar10 = 0; iVar10 < iVar8; iVar10 = iVar10 + 1) {
              for (lVar29 = 0; iVar8 = (int)lVar29, iVar8 < iVar19; lVar29 = lVar29 + 1) {
                _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[iVar9 + lVar29] = iVar28 + iVar8;
                iVar19 = this->kernel_w;
              }
              iVar9 = iVar9 + iVar8;
              iVar28 = iVar28 + iVar24 + iVar8;
              iVar8 = this->kernel_h;
            }
            iVar28 = iVar28 + iVar25 * iVar21;
          }
          lVar29 = (long)iVar20;
          lVar15 = (long)iVar22;
          iVar19 = (int)uVar31;
          if (this->pooling_type == 1) {
            if (this->avgpool_count_include_pad == 0) {
              uVar18 = 0;
              iVar19 = 0;
              iVar20 = 0;
              iVar22 = 0;
              if (this->pad_mode == 0) {
                iVar19 = (bottom_blob->w - bottom_blob_bordered.w) + this->pad_left +
                         this->pad_right;
                iVar20 = (bottom_blob->h - bottom_blob_bordered.h) + this->pad_top +
                         this->pad_bottom;
                iVar22 = (bottom_blob->d - bottom_blob_bordered.d) + this->pad_front +
                         this->pad_behind;
              }
              if ((int)_c < 1) {
                _c = uVar18;
              }
              while( true ) {
                if (uVar18 == _c) break;
                Mat::channel(&m,&bottom_blob_bordered,uVar18);
                Mat::channel(&local_120,top_blob,uVar18);
                local_1d8 = local_120.data;
                Mat::~Mat(&local_120);
                for (iVar8 = 0; iVar8 <= iVar4; iVar8 = iVar8 + 1) {
                  iVar25 = this->stride_d;
                  for (iVar24 = 0; iVar24 <= iVar3; iVar24 = iVar24 + 1) {
                    lVar32 = (long)(this->stride_h * iVar24);
                    for (lVar16 = 0; lVar16 <= lVar15; lVar16 = lVar16 + 1) {
                      iVar9 = this->stride_w;
                      iVar27 = 0;
                      fVar37 = 0.0;
                      for (iVar28 = 0; iVar28 < this->kernel_d; iVar28 = iVar28 + 1) {
                        iVar10 = iVar28 + iVar25 * iVar8;
                        if (this->pad_front <= iVar10) {
                          if ((iVar22 + iVar12) - this->pad_behind <= iVar10) break;
                          lVar36 = lVar32;
                          for (lVar17 = 0; lVar17 < this->kernel_h; lVar17 = lVar17 + 1) {
                            lVar14 = lVar32 + lVar17;
                            if (this->pad_top <= lVar14) {
                              if ((iVar20 + iVar11) - this->pad_bottom <= lVar14) break;
                              lVar14 = (long)(iVar9 * (int)lVar16);
                              for (lVar34 = 0; lVar34 < this->kernel_w; lVar34 = lVar34 + 1) {
                                if (this->pad_left <= lVar14) {
                                  if ((iVar19 + iVar21) - this->pad_right <= lVar14) break;
                                  Mat::depth(&local_120,&m,iVar10);
                                  fVar37 = fVar37 + *(float *)((long)local_120.data +
                                                              lVar14 * 4 +
                                                              local_120.elemsize * lVar36 *
                                                              (long)local_120.w);
                                  Mat::~Mat(&local_120);
                                  iVar27 = iVar27 + 1;
                                }
                                lVar14 = lVar14 + 1;
                              }
                            }
                            lVar36 = lVar36 + 1;
                          }
                        }
                      }
                      *(float *)((long)local_1d8 + lVar16 * 4) = fVar37 / (float)iVar27;
                    }
                    local_1d8 = (void *)((long)local_1d8 + lVar29 * 4);
                  }
                }
                Mat::~Mat(&m);
                uVar18 = uVar18 + 1;
              }
            }
            else {
              uVar33 = 0;
              uVar31 = uVar31 & 0xffffffff;
              if (iVar19 < 1) {
                uVar31 = uVar33;
              }
              uVar13 = (ulong)_c;
              if ((int)_c < 1) {
                uVar13 = uVar33;
              }
              while( true ) {
                iVar21 = (int)uVar33;
                if (iVar21 == (int)uVar13) break;
                Mat::channel(&m,&bottom_blob_bordered,iVar21);
                Mat::channel(&local_120,top_blob,iVar21);
                local_228 = local_120.data;
                Mat::~Mat(&local_120);
                for (iVar11 = 0; iVar11 <= iVar4; iVar11 = iVar11 + 1) {
                  for (iVar12 = 0; iVar12 <= iVar3; iVar12 = iVar12 + 1) {
                    for (lVar32 = 0; lVar32 <= lVar15; lVar32 = lVar32 + 1) {
                      Mat::depth(&local_120,&m,this->stride_d * iVar11);
                      pvVar7 = local_120.data;
                      lVar16 = (long)local_120.w * (long)this->stride_h * (long)iVar12 *
                               local_120.elemsize;
                      iVar22 = this->stride_w;
                      Mat::~Mat(&local_120);
                      fVar37 = 0.0;
                      for (uVar33 = 0; uVar31 != uVar33; uVar33 = uVar33 + 1) {
                        fVar37 = fVar37 + *(float *)((long)pvVar7 +
                                                    (long)_space_ofs.
                                                                                                                    
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start[uVar33] *
                                                  4 + (long)(int)lVar32 * (long)iVar22 * 4 + lVar16)
                        ;
                      }
                      *(float *)((long)local_228 + lVar32 * 4) = fVar37 * (1.0 / (float)iVar19);
                    }
                    local_228 = (void *)((long)local_228 + lVar29 * 4);
                  }
                }
                Mat::~Mat(&m);
                uVar33 = (ulong)(iVar21 + 1);
              }
            }
          }
          else if (this->pooling_type == 0) {
            uVar33 = 0;
            uVar31 = uVar31 & 0xffffffff;
            if (iVar19 < 1) {
              uVar31 = uVar33;
            }
            uVar13 = (ulong)_c;
            if ((int)_c < 1) {
              uVar13 = uVar33;
            }
            while( true ) {
              iVar19 = (int)uVar33;
              if (iVar19 == (int)uVar13) break;
              Mat::channel(&m,&bottom_blob_bordered,iVar19);
              Mat::channel(&local_120,top_blob,iVar19);
              local_228 = local_120.data;
              Mat::~Mat(&local_120);
              for (iVar21 = 0; iVar21 <= iVar4; iVar21 = iVar21 + 1) {
                for (iVar11 = 0; iVar11 <= iVar3; iVar11 = iVar11 + 1) {
                  for (lVar32 = 0; lVar32 <= lVar15; lVar32 = lVar32 + 1) {
                    Mat::depth(&local_120,&m,this->stride_d * iVar21);
                    pfVar1 = (float *)((long)local_120.data +
                                      (long)(int)lVar32 * (long)this->stride_w * 4 +
                                      (long)local_120.w * (long)this->stride_h * (long)iVar11 *
                                      local_120.elemsize);
                    Mat::~Mat(&local_120);
                    fVar37 = *pfVar1;
                    for (uVar33 = 0; uVar31 != uVar33; uVar33 = uVar33 + 1) {
                      fVar2 = pfVar1[_space_ofs.super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_start[uVar33]];
                      if (fVar37 <= fVar2) {
                        fVar37 = fVar2;
                      }
                    }
                    *(float *)((long)local_228 + lVar32 * 4) = fVar37;
                  }
                  local_228 = (void *)((long)local_228 + lVar29 * 4);
                }
              }
              Mat::~Mat(&m);
              uVar33 = (ulong)(iVar19 + 1);
            }
          }
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                    (&_space_ofs.super__Vector_base<int,_std::allocator<int>_>);
          iVar19 = 0;
        }
      }
      Mat::~Mat(&bottom_blob_bordered);
      return iVar19;
    }
    Mat::create(top_blob,this->out_w,this->out_h,this->out_d,_c,_elemsize,opt->blob_allocator);
    if (top_blob->data == (void *)0x0) {
      return -100;
    }
    if ((long)top_blob->c * top_blob->cstep == 0) {
      return -100;
    }
    if (this->pooling_type == 0) {
      if ((int)_c < 1) {
        _c = 0;
      }
      for (uVar18 = 0; uVar18 != _c; uVar18 = uVar18 + 1) {
        Mat::channel(&bottom_blob_bordered,bottom_blob,uVar18);
        pvVar7 = bottom_blob_bordered.data;
        Mat::~Mat(&bottom_blob_bordered);
        Mat::channel(&bottom_blob_bordered,top_blob,uVar18);
        local_228 = bottom_blob_bordered.data;
        Mat::~Mat(&bottom_blob_bordered);
        iVar3 = this->out_h;
        iVar4 = this->out_d;
        iVar22 = 0;
        iVar12 = 0;
        if (0 < iVar3) {
          iVar12 = iVar3;
        }
        iVar20 = 0;
        if (0 < iVar4) {
          iVar20 = iVar4;
        }
        while (iVar22 != iVar20) {
          iVar8 = (iVar22 * iVar11) / iVar4;
          iVar22 = iVar22 + 1;
          uVar5 = this->out_w;
          iVar25 = 0;
          uVar31 = 0;
          if (0 < (int)uVar5) {
            uVar31 = (ulong)uVar5;
          }
          while (iVar25 != iVar12) {
            uVar33 = (long)(iVar25 * iVar21) / (long)iVar3;
            iVar25 = iVar25 + 1;
            uVar13 = 0;
            while (uVar13 != uVar31) {
              iVar24 = (iVar19 * (int)uVar13) / (int)uVar5;
              iVar28 = iVar24 + ((int)uVar33 + iVar8 * iVar21) * iVar19;
              fVar37 = *(float *)((long)pvVar7 + (long)iVar28 * 4);
              for (iVar9 = iVar8; iVar9 < (iVar22 * iVar11 + iVar4 + -1) / iVar4; iVar9 = iVar9 + 1)
              {
                iVar27 = iVar28;
                for (uVar23 = uVar33 & 0xffffffff; lVar29 = (long)iVar24, iVar10 = iVar27,
                    (int)uVar23 < (iVar25 * iVar21 + iVar3 + -1) / iVar3;
                    uVar23 = (ulong)((int)uVar23 + 1)) {
                  for (; lVar29 < (int)((int)(uVar13 + 1) * iVar19 + (uVar5 - 1)) / (int)uVar5;
                      lVar29 = lVar29 + 1) {
                    fVar2 = *(float *)((long)pvVar7 + (long)iVar10 * 4);
                    if (fVar37 <= fVar2) {
                      fVar37 = fVar2;
                    }
                    iVar10 = iVar10 + 1;
                  }
                  iVar27 = iVar27 + iVar19;
                }
                iVar28 = iVar28 + iVar21 * iVar19;
              }
              *(float *)((long)local_228 + uVar13 * 4) = fVar37;
              uVar13 = uVar13 + 1;
            }
            local_228 = (void *)((long)local_228 + (long)(int)uVar5 * 4);
          }
        }
      }
      return 0;
    }
    if (this->pooling_type == 1) {
      if ((int)_c < 1) {
        _c = 0;
      }
      for (uVar18 = 0; uVar18 != _c; uVar18 = uVar18 + 1) {
        Mat::channel(&bottom_blob_bordered,bottom_blob,uVar18);
        pvVar7 = bottom_blob_bordered.data;
        Mat::~Mat(&bottom_blob_bordered);
        Mat::channel(&bottom_blob_bordered,top_blob,uVar18);
        local_210 = bottom_blob_bordered.data;
        Mat::~Mat(&bottom_blob_bordered);
        iVar3 = this->out_h;
        iVar4 = this->out_d;
        iVar22 = 0;
        iVar12 = 0;
        if (0 < iVar3) {
          iVar12 = iVar3;
        }
        iVar20 = 0;
        if (0 < iVar4) {
          iVar20 = iVar4;
        }
        while (iVar22 != iVar20) {
          iVar24 = (iVar22 * iVar11) / iVar4;
          iVar22 = iVar22 + 1;
          iVar8 = (iVar22 * iVar11 + iVar4 + -1) / iVar4;
          uVar5 = this->out_w;
          iVar25 = 0;
          uVar31 = 0;
          if (0 < (int)uVar5) {
            uVar31 = (ulong)uVar5;
          }
          while (iVar25 != iVar12) {
            uVar33 = (long)(iVar25 * iVar21) / (long)iVar3;
            iVar25 = iVar25 + 1;
            iVar9 = (iVar25 * iVar21 + iVar3 + -1) / iVar3;
            iVar28 = (int)uVar33;
            uVar13 = 0;
            while (uVar13 != uVar31) {
              iVar26 = (iVar19 * (int)uVar13) / (int)uVar5;
              iVar10 = (int)((int)(uVar13 + 1) * iVar19 + (uVar5 - 1)) / (int)uVar5;
              iVar30 = (iVar28 + iVar24 * iVar21) * iVar19 + iVar26;
              fVar37 = 0.0;
              for (iVar27 = iVar24; iVar27 < iVar8; iVar27 = iVar27 + 1) {
                iVar35 = iVar30;
                for (uVar23 = uVar33 & 0xffffffff; lVar29 = (long)iVar26, iVar6 = iVar35,
                    (int)uVar23 < iVar9; uVar23 = (ulong)((int)uVar23 + 1)) {
                  for (; lVar29 < iVar10; lVar29 = lVar29 + 1) {
                    fVar37 = fVar37 + *(float *)((long)pvVar7 + (long)iVar6 * 4);
                    iVar6 = iVar6 + 1;
                  }
                  iVar35 = iVar35 + iVar19;
                }
                iVar30 = iVar30 + iVar21 * iVar19;
              }
              *(float *)((long)local_210 + uVar13 * 4) =
                   fVar37 / ((float)(iVar10 - iVar26) *
                            (float)(iVar9 - iVar28) * (float)(iVar8 - iVar24));
              uVar13 = uVar13 + 1;
            }
            local_210 = (void *)((long)local_210 + (long)(int)uVar5 * 4);
          }
        }
      }
      return 0;
    }
  }
  else {
    Mat::create(top_blob,_c,_elemsize,opt->blob_allocator);
    if (top_blob->data == (void *)0x0) {
      return -100;
    }
    if ((long)top_blob->c * top_blob->cstep == 0) {
      return -100;
    }
    uVar18 = iVar21 * iVar19 * iVar11;
    if (this->pooling_type == 1) {
      uVar5 = uVar18;
      if ((int)uVar18 < 1) {
        uVar5 = 0;
      }
      uVar31 = (ulong)_c;
      if ((int)_c < 1) {
        uVar31 = 0;
      }
      for (uVar33 = 0; uVar33 != uVar31; uVar33 = uVar33 + 1) {
        Mat::channel(&bottom_blob_bordered,bottom_blob,(int)uVar33);
        pvVar7 = bottom_blob_bordered.data;
        Mat::~Mat(&bottom_blob_bordered);
        fVar37 = 0.0;
        for (uVar13 = 0; uVar5 != uVar13; uVar13 = uVar13 + 1) {
          fVar37 = fVar37 + *(float *)((long)pvVar7 + uVar13 * 4);
        }
        *(float *)((long)top_blob->data + uVar33 * 4) = fVar37 * (1.0 / (float)(int)uVar18);
      }
      return 0;
    }
    if (this->pooling_type == 0) {
      if ((int)uVar18 < 1) {
        uVar18 = 0;
      }
      uVar31 = (ulong)_c;
      if ((int)_c < 1) {
        uVar31 = 0;
      }
      for (uVar33 = 0; uVar33 != uVar31; uVar33 = uVar33 + 1) {
        Mat::channel(&bottom_blob_bordered,bottom_blob,(int)uVar33);
        pvVar7 = bottom_blob_bordered.data;
        Mat::~Mat(&bottom_blob_bordered);
        fVar37 = *pvVar7;
        for (uVar13 = 0; uVar18 != uVar13; uVar13 = uVar13 + 1) {
          fVar2 = *(float *)((long)pvVar7 + uVar13 * 4);
          if (fVar37 <= fVar2) {
            fVar37 = fVar2;
          }
        }
        *(float *)((long)top_blob->data + uVar33 * 4) = fVar37;
      }
      return 0;
    }
  }
  return 0;
}

Assistant:

int Pooling3D::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // max value in NxN window
    // avg value in NxN window

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    //     NCNN_LOGE("Pooling     input %d x %d  pad = %d %d %d %d  ksize=%d %d  stride=%d %d", w, h, pad_left, pad_right, pad_top, pad_bottom, kernel_w, kernel_h, stride_w, stride_h);
    if (global_pooling)
    {
        top_blob.create(channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        int size = w * h * d;

        if (pooling_type == PoolMethod_MAX)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);

                float max_value = ptr[0];
                for (int i = 0; i < size; i++)
                {
                    max_value = std::max(max_value, ptr[i]);
                }

                top_blob[q] = max_value;
            }
        }
        else if (pooling_type == PoolMethod_AVE)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);

                float sum = 0.f;
                for (int i = 0; i < size; i++)
                {
                    sum += ptr[i];
                }

                top_blob[q] = sum / size;
            }
        }

        return 0;
    }

    if (adaptive_pooling)
    {
        top_blob.create(out_w, out_h, out_d, channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (pooling_type == PoolMethod_MAX)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* inptr = bottom_blob.channel(q);
                float* outptr = top_blob.channel(q);

                for (int z = 0; z < out_d; z++)
                {
                    // floor div
                    const int id0 = d * z / out_d;
                    // ceil div
                    const int id1 = (d * (z + 1) + out_d - 1) / out_d;
                    for (int i = 0; i < out_h; i++)
                    {
                        // floor div
                        const int ih0 = h * i / out_h;
                        // ceil div
                        const int ih1 = (h * (i + 1) + out_h - 1) / out_h;
                        for (int j = 0; j < out_w; j++)
                        {
                            // floor div
                            const int iw0 = w * j / out_w;
                            // ceil div
                            const int iw1 = (w * (j + 1) + out_w - 1) / out_w;

                            float max_value = inptr[id0 * w * h + ih0 * w + iw0];

                            for (int id = id0; id < id1; id++)
                            {
                                for (int ih = ih0; ih < ih1; ih++)
                                {
                                    for (int iw = iw0; iw < iw1; iw++)
                                    {
                                        max_value = std::max(max_value, inptr[id * w * h + ih * w + iw]);
                                    }
                                }
                            }

                            outptr[j] = max_value;
                        }

                        outptr += out_w;
                    }
                }
            }
        }
        else if (pooling_type == PoolMethod_AVE)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* inptr = bottom_blob.channel(q);
                float* outptr = top_blob.channel(q);

                for (int z = 0; z < out_d; z++)
                {
                    // floor div
                    const int id0 = d * z / out_d;
                    // ceil div
                    const int id1 = (d * (z + 1) + out_d - 1) / out_d;
                    int dk = id1 - id0;
                    for (int i = 0; i < out_h; i++)
                    {
                        // floor div
                        const int ih0 = h * i / out_h;
                        // ceil div
                        const int ih1 = (h * (i + 1) + out_h - 1) / out_h;
                        int hk = ih1 - ih0;
                        for (int j = 0; j < out_w; j++)
                        {
                            // floor div
                            const int iw0 = w * j / out_w;
                            // ceil div
                            const int iw1 = (w * (j + 1) + out_w - 1) / out_w;
                            int wk = iw1 - iw0;

                            float sum = 0;
                            for (int id = id0; id < id1; id++)
                            {
                                for (int ih = ih0; ih < ih1; ih++)
                                {
                                    for (int iw = iw0; iw < iw1; iw++)
                                    {
                                        sum += inptr[id * w * h + ih * w + iw];
                                    }
                                }
                            }

                            outptr[j] = sum / hk / wk / dk;
                        }

                        outptr += out_w;
                    }
                }
            }
        }

        return 0;
    }

    Mat bottom_blob_bordered;
    Option opt_pad = opt;
    opt_pad.use_packing_layout = false;
    make_padding(bottom_blob, bottom_blob_bordered, opt_pad);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;
    d = bottom_blob_bordered.d;

    int outw = (w - kernel_w) / stride_w + 1;
    int outh = (h - kernel_h) / stride_h + 1;
    int outd = (d - kernel_d) / stride_d + 1;

    top_blob.create(outw, outh, outd, channels, elemsize);
    if (top_blob.empty())
        return -100;

    const int maxk = kernel_w * kernel_h * kernel_d;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap0 = w - kernel_w;
        int gap1 = h * w - w * kernel_h;
        for (int z = 0; z < kernel_d; z++)
        {
            for (int i = 0; i < kernel_h; i++)
            {
                for (int j = 0; j < kernel_w; j++)
                {
                    space_ofs[p1] = p2;
                    p1++;
                    p2 += 1;
                }
                p2 += gap0;
            }
            p2 += gap1;
        }
    }

    if (pooling_type == PoolMethod_MAX)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const Mat m = bottom_blob_bordered.channel(q);
            float* outptr = top_blob.channel(q);
            for (int z = 0; z < outd; z++)
            {
                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        const float* sptr = m.depth(z * stride_d).row(i * stride_h) + j * stride_w;

                        float max_value = sptr[0];

                        for (int l = 0; l < maxk; l++)
                        {
                            float val = sptr[space_ofs[l]];
                            max_value = std::max(max_value, val);
                        }

                        outptr[j] = max_value;
                    }

                    outptr += outw;
                }
            }
        }
    }
    else if (pooling_type == PoolMethod_AVE)
    {
        if (avgpool_count_include_pad == 0)
        {
            int wtailpad = 0;
            int htailpad = 0;
            int dtailpad = 0;

            if (pad_mode == 0) // full padding
            {
                wtailpad = bottom_blob_bordered.w - bottom_blob.w - pad_left - pad_right;
                htailpad = bottom_blob_bordered.h - bottom_blob.h - pad_top - pad_bottom;
                dtailpad = bottom_blob_bordered.d - bottom_blob.d - pad_front - pad_behind;
            }

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const Mat m = bottom_blob_bordered.channel(q);
                float* outptr = top_blob.channel(q);

                for (int z = 0; z < outd; z++)
                {
                    int sz0 = z * stride_d;

                    for (int i = 0; i < outh; i++)
                    {
                        int sy0 = i * stride_h;

                        for (int j = 0; j < outw; j++)
                        {
                            int sx0 = j * stride_w;

                            float sum = 0;
                            int area = 0;
                            for (int kd = 0; kd < kernel_d; kd++)
                            {
                                int sz = sz0 + kd;

                                if (sz < pad_front)
                                    continue;

                                if (sz >= d - pad_behind - dtailpad)
                                    break;

                                for (int ki = 0; ki < kernel_h; ki++)
                                {
                                    int sy = sy0 + ki;

                                    if (sy < pad_top)
                                        continue;

                                    if (sy >= h - pad_bottom - htailpad)
                                        break;

                                    for (int kj = 0; kj < kernel_w; kj++)
                                    {
                                        int sx = sx0 + kj;

                                        if (sx < pad_left)
                                            continue;

                                        if (sx >= w - pad_right - wtailpad)
                                            break;

                                        float val = m.depth(sz).row(sy)[sx];
                                        sum += val;
                                        area += 1;
                                    }
                                }
                            }

                            outptr[j] = sum / area;
                        }

                        outptr += outw;
                    }
                }
            }
        }
        else // if (avgpool_count_include_pad == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const Mat m = bottom_blob_bordered.channel(q);
                float* outptr = top_blob.channel(q);

                for (int z = 0; z < outd; z++)
                {
                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            const float* sptr = m.depth(z * stride_d).row(i * stride_h) + j * stride_w;

                            float sum = 0;

                            for (int l = 0; l < maxk; l++)
                            {
                                float val = sptr[space_ofs[l]];
                                sum += val;
                            }

                            outptr[j] = sum / maxk;
                        }

                        outptr += outw;
                    }
                }
            }
        }
    }

    return 0;
}